

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rock_sample.cpp
# Opt level: O2

void __thiscall
despot::RockSample::PrintObs(RockSample *this,State *state,OBS_TYPE observation,ostream *out)

{
  ostream *poVar1;
  
  if (observation < 3) {
    poVar1 = std::operator<<(out,&DAT_00117810 + *(int *)(&DAT_00117810 + observation * 4));
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  return;
}

Assistant:

void RockSample::PrintObs(const State& state, OBS_TYPE observation,
	ostream& out) const {
	switch (observation) {
	case E_NONE:
		out << "None" << endl;
		break;
	case E_GOOD:
		out << "Good" << endl;
		break;
	case E_BAD:
		out << "Bad" << endl;
		break;
	}
}